

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall asmjit::Logger::setIndentation(Logger *this,char *indentation)

{
  size_t __n;
  
  this->_indentation[8] = '\0';
  this->_indentation[9] = '\0';
  this->_indentation[10] = '\0';
  this->_indentation[0xb] = '\0';
  this->_indentation[0] = '\0';
  this->_indentation[1] = '\0';
  this->_indentation[2] = '\0';
  this->_indentation[3] = '\0';
  this->_indentation[4] = '\0';
  this->_indentation[5] = '\0';
  this->_indentation[6] = '\0';
  this->_indentation[7] = '\0';
  if (indentation != (char *)0x0) {
    for (__n = 0; (__n != 0xb && (indentation[__n] != '\0')); __n = __n + 1) {
    }
    memcpy(this->_indentation,indentation,__n);
    return;
  }
  return;
}

Assistant:

void Logger::setIndentation(const char* indentation) noexcept {
  ::memset(_indentation, 0, ASMJIT_ARRAY_SIZE(_indentation));
  if (!indentation)
    return;

  size_t length = Utils::strLen(indentation, ASMJIT_ARRAY_SIZE(_indentation) - 1);
  ::memcpy(_indentation, indentation, length);
}